

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::~CheckerVisitor(CheckerVisitor *this)

{
  pointer ppEVar1;
  __node_base *p_Var2;
  pointer ppEVar3;
  
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR__CheckerVisitor_0019ae00;
  p_Var2 = &(this->functionInfoMap)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    if (*(FunctionInfo **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor !=
        (FunctionInfo *)0x0) {
      FunctionInfo::~FunctionInfo
                (*(FunctionInfo **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor);
    }
  }
  ppEVar1 = (this->externalValues).
            super__Vector_base<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar3 = (this->externalValues).
                 super__Vector_base<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar3 != ppEVar1;
      ppEVar3 = ppEVar3 + 1) {
    (**((*ppEVar3)->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj)();
  }
  std::
  _Vector_base<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
  ::~_Vector_base(&(this->externalValues).
                   super__Vector_base<SQCompilation::ExternalValueExpr_*,_std::allocator<SQCompilation::ExternalValueExpr_*>_>
                 );
  std::
  _Hashtable<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->astValues)._M_h);
  std::
  _Hashtable<const_char_*,_const_char_*,_std::allocator<const_char_*>,_std::__detail::_Identity,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->persistedKeys)._M_h);
  std::
  _Hashtable<const_char_*,_const_char_*,_std::allocator<const_char_*>,_std::__detail::_Identity,_SQCompilation::StringEqualer,_SQCompilation::StringHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->requiredModules)._M_h);
  std::
  _Hashtable<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->functionInfoMap)._M_h);
  std::
  _Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::~_Vector_base(&(this->nodeStack).
                   super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                 );
  return;
}

Assistant:

CheckerVisitor::~CheckerVisitor() {
  for (auto &p : functionInfoMap) {
    if (p.second)
      p.second->~FunctionInfo();
  }
  for (auto ev : externalValues)
    ev->~ExternalValueExpr();
}